

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

bool __thiscall chatra::RuntimeImp::distributeStringTable(RuntimeImp *this,uint oldVersion)

{
  StringTable *this_00;
  bool bVar1;
  EVP_PKEY_CTX *src;
  __node_base *p_Var2;
  lock_guard<chatra::SpinLock> lock;
  
  this_00 = (this->primarySTable).
            super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((oldVersion == 0xffffffff) || (this_00->version != oldVersion)) {
    StringTable::clearDirty(this_00);
    SpinLock::lock(&this->lockSTable);
    StringTable::copy((StringTable *)&stack0xffffffffffffffd8,
                      (EVP_PKEY_CTX *)
                      (this->primarySTable).
                      super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,src
                     );
    std::__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->distributedSTable).
                super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffd8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    (this->lockSTable).flag.super___atomic_flag_base._M_i = false;
    SpinLock::lock(&(this->threadIds).lockValues);
    p_Var2 = &(this->threadIds).values._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      LOCK();
      *(undefined1 *)
       &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)[7]._M_nxt
           = 1;
      UNLOCK();
    }
    (this->threadIds).lockValues.flag.super___atomic_flag_base._M_i = false;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RuntimeImp::distributeStringTable(unsigned oldVersion) {
	if (oldVersion != UINT_MAX && oldVersion == primarySTable->getVersion())
		return false;

	primarySTable->clearDirty();
	{
		std::lock_guard<SpinLock> lock0(lockSTable);
		distributedSTable = primarySTable->copy();
	}
	threadIds.forEach([&](Thread& thread) {
		thread.hasNewSTable = true;
	});

	return true;
}